

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_SpawnMissile(FParser *this)

{
  bool bVar1;
  PClassActor *type;
  AActor *source;
  AActor *dest;
  svalue_t local_30;
  
  bVar1 = CheckArgs(this,3);
  if (bVar1) {
    svalue_t::svalue_t(&local_30,this->t_argv + 2);
    type = T_GetMobjType(&local_30);
    FString::~FString(&local_30.string);
    if (type != (PClassActor *)0x0) {
      source = actorvalue(this->t_argv);
      dest = actorvalue(this->t_argv + 1);
      if (dest != (AActor *)0x0 && source != (AActor *)0x0) {
        P_SpawnMissile(source,dest,type,(AActor *)0x0);
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_SpawnMissile()
{
	AActor *mobj;
	AActor *target;
	PClassActor * pclass;

	if (CheckArgs(3))
	{
		if (!(pclass=T_GetMobjType(t_argv[2]))) return;

		mobj = actorvalue(t_argv[0]);
		target = actorvalue(t_argv[1]);
		if (mobj && target) P_SpawnMissile(mobj, target, pclass);
	}
}